

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O0

LibraryArticulatedSystemsLoader * __thiscall
COLLADASaxFWL::RootParser15::
beginCommonWithId<COLLADASaxFWL::LibraryArticulatedSystemsLoader,COLLADASaxFWL::LibraryArticulatedSystemsLoader15>
          (RootParser15 *this,char *id)

{
  LibraryArticulatedSystemsLoader *this_00;
  IParserImpl *parserImpl;
  LibraryArticulatedSystemsLoader *in_RDI;
  LibraryArticulatedSystemsLoader15 *loader15;
  LibraryArticulatedSystemsLoader *loader;
  LibraryArticulatedSystemsLoader *in_stack_ffffffffffffff98;
  LibraryArticulatedSystemsLoader15 *in_stack_ffffffffffffffa0;
  IParserImpl *local_50;
  IFilePartLoader *in_stack_ffffffffffffffb8;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)in_stack_ffffffffffffffa0);
  this_00 = (LibraryArticulatedSystemsLoader *)operator_new(0xd0);
  LibraryArticulatedSystemsLoader::LibraryArticulatedSystemsLoader(in_RDI,in_stack_ffffffffffffffb8)
  ;
  parserImpl = (IParserImpl *)operator_new(0x20);
  LibraryArticulatedSystemsLoader15::LibraryArticulatedSystemsLoader15
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  IFilePartLoader::setParserImpl((IFilePartLoader *)this_00,parserImpl);
  IFilePartLoader::setPartLoader
            (*(IFilePartLoader **)&in_RDI->mCurrentArticulatedId,(IFilePartLoader *)this_00);
  local_50 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    local_50 = parserImpl + 1;
  }
  (**(code **)(**(long **)&in_RDI->mCurrentArticulatedId + 0x50))
            (*(long **)&in_RDI->mCurrentArticulatedId,local_50);
  DocumentProcessor::addToSidTree((DocumentProcessor *)this,id,(char *)loader);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}